

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double bernoulli_number3(int n)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = 0.0;
  if (-1 < n) {
    if ((uint)n < 3) {
      dVar2 = *(double *)(&DAT_00224368 + (ulong)(uint)n * 8);
    }
    else if ((n & 1U) == 0) {
      iVar1 = 1;
      dVar4 = 0.0;
      while (iVar1 != 0x3e9) {
        dVar2 = pow((double)iVar1,(double)n);
        dVar4 = dVar4 + 1.0 / dVar2;
        dVar2 = ABS(1.0 / dVar2);
        if ((dVar2 < 5e-07) || (iVar1 = iVar1 + 1, dVar2 < ABS(dVar4) * 5e-07)) break;
      }
      dVar3 = r8_factorial(n);
      dVar2 = pow(6.283185307179586,(double)n);
      dVar2 = (dVar3 * (dVar4 + dVar4)) / dVar2;
      if ((n & 2U) == 0) {
        dVar2 = -dVar2;
      }
    }
  }
  return dVar2;
}

Assistant:

BURKHARDT_EXPORT
double bernoulli_number3 ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_NUMBER3 computes the value of the Bernoulli number B(N).
//
//  Discussion:
//
//    The Bernoulli numbers are rational.
//
//    If we define the sum of the M-th powers of the first N integers as:
//
//      SIGMA(M,N) = sum ( 0 <= I <= N ) I**M
//
//    and let C(I,J) be the combinatorial coefficient:
//
//      C(I,J) = I! / ( ( I - J )! * J! )
//
//    then the Bernoulli numbers B(J) satisfy:
//
//      SIGMA(M,N) = 1/(M+1) * sum ( 0 <= J <= M ) 
//        C(M+1,J) B(J) * (N+1)^(M+1-J)
//
//  First values:
//
//     B0  1                   =         1.00000000000
//     B1 -1/2                 =        -0.50000000000
//     B2  1/6                 =         1.66666666666
//     B3  0                   =         0
//     B4 -1/30                =        -0.03333333333
//     B5  0                   =         0
//     B6  1/42                =         0.02380952380
//     B7  0                   =         0
//     B8 -1/30                =        -0.03333333333
//     B9  0                   =         0
//    B10  5/66                =         0.07575757575
//    B11  0                   =         0
//    B12 -691/2730            =        -0.25311355311
//    B13  0                   =         0
//    B14  7/6                 =         1.16666666666
//    B15  0                   =         0
//    B16 -3617/510            =        -7.09215686274
//    B17  0                   =         0
//    B18  43867/798           =        54.97117794486
//    B19  0                   =         0
//    B20 -174611/330          =      -529.12424242424
//    B21  0                   =         0
//    B22  854513/138          =      6192.123
//    B23  0                   =         0
//    B24 -236364091/2730      =    -86580.257
//    B25  0                   =         0
//    B26  8553103/6           =   1425517.16666
//    B27  0                   =         0
//    B28 -23749461029/870     = -27298231.0678
//    B29  0                   =         0
//    B30  8615841276005/14322 = 601580873.901
//
//  Recursion:
//
//    With C(N+1,K) denoting the standard binomial coefficient,
//
//    B(0) = 1.0
//    B(N) = - ( sum ( 0 <= K < N ) C(N+1,K) * B(K) ) / C(N+1,N)
//
//  Special Values:
//
//    Except for B(1), all Bernoulli numbers of odd index are 0.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the Bernoulli number to compute.
//
//    Output, double BERNOULLI_NUMBER3, the desired Bernoulli number.
//
{
  int i;
  int itmax = 1000;
  const double r8_pi = 3.141592653589793;
  double sum2;
  double term;
  double tol = 5.0E-07;
  double value;

  if ( n < 0 )
  {
    value = 0.0;
  }
  else if ( n == 0 )
  {
    value = 1.0;
  }
  else if ( n == 1 )
  {
    value = -0.5;
  }
  else if ( n == 2 )
  {
    value = 1.0 / 6.0;
  }
  else if ( ( n % 2 ) == 1 )
  {
    value = 0.0;
  }
  else
  {
    sum2 = 0.0;

    for ( i = 1; i <= itmax; i++ )
    {
      term = 1.0 / pow ( double(i), n );
      sum2 = sum2 + term;

      if ( fabs ( term ) < tol || fabs ( term ) < tol * fabs ( sum2 ) )
      {
        break;
      }

    }

    value = 2.0 * sum2 * r8_factorial ( n ) 
      / pow ( ( 2.0 * r8_pi ), n );

    if ( ( n % 4 ) == 0 )
    {
      value = -value;
    }

  }

  return value;
}